

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readStrings(WasmBinaryReader *this)

{
  uint32_t uVar1;
  char *in_RCX;
  ulong uVar2;
  bool bVar3;
  Name NVar4;
  string_view str;
  stringstream local_238 [8];
  stringstream wtf16;
  String local_228 [376];
  IString local_b0;
  string local_a0;
  string local_80;
  string local_60;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_40;
  WasmBinaryReader *local_38;
  
  uVar1 = getU32LEB(this);
  if (uVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"unexpected reserved value in strings",
               (allocator<char> *)local_238);
    throwError(this,&local_a0);
  }
  uVar1 = getU32LEB(this);
  uVar2 = (ulong)uVar1;
  local_40 = &this->strings;
  local_38 = this;
  while( true ) {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return;
    }
    NVar4 = getInlineString(this,false);
    str._M_len = NVar4.super_IString.str._M_str;
    std::__cxx11::stringstream::stringstream(local_238);
    str._M_str = in_RCX;
    bVar3 = String::convertWTF8ToWTF16(local_228,NVar4.super_IString.str._M_len,str);
    if (!bVar3) break;
    std::__cxx11::stringbuf::str();
    this = local_38;
    IString::IString(&local_b0,&local_60);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
              (local_40,(Name *)&local_b0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::stringstream::~stringstream(local_238);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"invalid string constant",(allocator<char> *)&local_60);
  throwError(local_38,&local_80);
}

Assistant:

void WasmBinaryReader::readStrings() {
  auto reserved = getU32LEB();
  if (reserved != 0) {
    throwError("unexpected reserved value in strings");
  }
  size_t num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto string = getInlineString(false);
    // Re-encode from WTF-8 to WTF-16.
    std::stringstream wtf16;
    if (!String::convertWTF8ToWTF16(wtf16, string.str)) {
      throwError("invalid string constant");
    }
    // TODO: Use wtf16.view() once we have C++20.
    strings.push_back(wtf16.str());
  }
}